

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender __thiscall
fmt::v10::detail::digit_grouping<char>::apply<fmt::v10::appender,char>
          (digit_grouping<char> *this,appender out,basic_string_view<char> digits)

{
  int iVar1;
  type tVar2;
  size_t sVar3;
  int *piVar4;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> out_00;
  char *pcVar5;
  buffer<char> *in_RSI;
  long in_RDI;
  next_state nVar6;
  int sep_index;
  int i_1;
  int i;
  next_state state;
  basic_memory_buffer<int,_500UL,_std::allocator<int>_> separators;
  int num_digits;
  allocator<int> *in_stack_fffffffffffff728;
  basic_memory_buffer<int,_500UL,_std::allocator<int>_> *in_stack_fffffffffffff730;
  next_state *in_stack_fffffffffffff750;
  undefined4 in_stack_fffffffffffff758;
  int in_stack_fffffffffffff75c;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_890;
  char local_881;
  buffer<char> *local_880;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_878;
  int local_86c;
  int local_868;
  int local_864;
  char *local_860;
  int local_858;
  char *local_850;
  int local_848;
  undefined4 local_840;
  buffer<int> local_828 [63];
  int local_2c;
  basic_string_view<char> local_20;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_10;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_8;
  
  local_10.container = in_RSI;
  sVar3 = basic_string_view<char>::size(&local_20);
  local_2c = (int)sVar3;
  std::allocator<int>::allocator((allocator<int> *)0x36c2ca);
  basic_memory_buffer<int,_500UL,_std::allocator<int>_>::basic_memory_buffer
            (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  std::allocator<int>::~allocator((allocator<int> *)0x36c2eb);
  local_840 = 0;
  buffer<int>::push_back
            (&in_stack_fffffffffffff730->super_buffer<int>,(int *)in_stack_fffffffffffff728);
  nVar6 = initial_state((digit_grouping<char> *)0x36c317);
  local_860 = (char *)nVar6.group._M_current;
  local_858 = nVar6.pos;
  local_850 = local_860;
  local_848 = local_858;
  while ((in_stack_fffffffffffff75c =
               next((digit_grouping<char> *)
                    CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                    in_stack_fffffffffffff750), local_864 = in_stack_fffffffffffff75c,
         in_stack_fffffffffffff75c != 0 && (in_stack_fffffffffffff75c < local_2c))) {
    buffer<int>::push_back
              (&in_stack_fffffffffffff730->super_buffer<int>,(int *)in_stack_fffffffffffff728);
  }
  local_868 = 0;
  sVar3 = buffer<int>::size(local_828);
  local_86c = (int)sVar3 + -1;
  for (; local_868 < local_2c; local_868 = local_868 + 1) {
    iVar1 = local_2c - local_868;
    piVar4 = buffer<int>::operator[]<int>(local_828,local_86c);
    if (iVar1 == *piVar4) {
      in_stack_fffffffffffff728 = (allocator<int> *)(in_RDI + 0x20);
      out_00.container = (buffer<char> *)std::__cxx11::string::data();
      in_stack_fffffffffffff730 =
           (basic_memory_buffer<int,_500UL,_std::allocator<int>_> *)std::__cxx11::string::data();
      std::__cxx11::string::size();
      local_880 = local_10.container;
      local_878.container =
           (buffer<char> *)
           copy_str<char,char_const*>
                     ((char *)in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff728,
                      out_00.container);
      local_86c = local_86c + -1;
      local_10.container = local_878.container;
    }
    tVar2 = to_unsigned<int>(0);
    pcVar5 = basic_string_view<char>::operator[](&local_20,(ulong)tVar2);
    local_881 = *pcVar5;
    local_890.container = (buffer<char> *)appender::operator++((appender *)&local_10,0);
    std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_890);
    std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=
              ((back_insert_iterator<fmt::v10::detail::buffer<char>_> *)in_stack_fffffffffffff730,
               (value_type *)in_stack_fffffffffffff728);
  }
  local_8.container = local_10.container;
  basic_memory_buffer<int,_500UL,_std::allocator<int>_>::~basic_memory_buffer
            (in_stack_fffffffffffff730);
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_8.container;
}

Assistant:

Out apply(Out out, basic_string_view<C> digits) const {
    auto num_digits = static_cast<int>(digits.size());
    auto separators = basic_memory_buffer<int>();
    separators.push_back(0);
    auto state = initial_state();
    while (int i = next(state)) {
      if (i >= num_digits) break;
      separators.push_back(i);
    }
    for (int i = 0, sep_index = static_cast<int>(separators.size() - 1);
         i < num_digits; ++i) {
      if (num_digits - i == separators[sep_index]) {
        out =
            copy_str<Char>(thousands_sep_.data(),
                           thousands_sep_.data() + thousands_sep_.size(), out);
        --sep_index;
      }
      *out++ = static_cast<Char>(digits[to_unsigned(i)]);
    }
    return out;
  }